

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O0

void deqp::gls::InteractionTestUtil::computeRandomQuad
               (Random *rnd,IntegerQuad *quad,int targetWidth,int targetHeight)

{
  float local_8c;
  int local_84;
  float local_80;
  int local_78;
  undefined8 local_74;
  undefined8 local_6c;
  int local_64;
  Vector<int,_2> VStack_60;
  int ndx;
  Vector<int,_2> local_58;
  float local_50;
  byte local_4a;
  byte local_49;
  float depth;
  bool flipY;
  int iStack_44;
  bool flipX;
  int y;
  int x;
  int height;
  int width;
  int maxH;
  int maxW;
  int minH;
  int minW;
  float minSize;
  int maxOutOfBounds;
  int targetHeight_local;
  int targetWidth_local;
  IntegerQuad *quad_local;
  Random *rnd_local;
  
  minW = 0;
  minH = 0x3f000000;
  minSize = (float)targetHeight;
  maxOutOfBounds = targetWidth;
  _targetHeight_local = quad;
  quad_local = (IntegerQuad *)rnd;
  maxW = ::deCeilFloatToInt32((float)targetWidth * 0.5);
  maxH = ::deCeilFloatToInt32((float)(int)minSize * 0.5);
  width = maxOutOfBounds;
  height = (int)minSize;
  x = de::Random::getInt((Random *)quad_local,maxW,maxOutOfBounds);
  y = de::Random::getInt((Random *)quad_local,maxH,height);
  iStack_44 = de::Random::getInt((Random *)quad_local,0,maxOutOfBounds - x);
  depth = (float)de::Random::getInt((Random *)quad_local,0,(int)minSize - y);
  local_49 = de::Random::getBool((Random *)quad_local);
  local_4a = de::Random::getBool((Random *)quad_local);
  local_50 = de::Random::choose<float,float_const*>
                       ((Random *)quad_local,computeRandomQuad::depthValues,
                        getRandomColor::components);
  if ((local_49 & 1) == 0) {
    local_78 = iStack_44;
  }
  else {
    local_78 = iStack_44 + x + -1;
  }
  if ((local_4a & 1) == 0) {
    local_80 = depth;
  }
  else {
    local_80 = (float)((int)depth + y + -1);
  }
  tcu::Vector<int,_2>::Vector(&local_58,local_78,(int)local_80);
  *&(_targetHeight_local->posA).m_data = local_58.m_data;
  if ((local_49 & 1) == 0) {
    local_84 = iStack_44 + x + -1;
  }
  else {
    local_84 = iStack_44;
  }
  if ((local_4a & 1) == 0) {
    local_8c = (float)((int)depth + y + -1);
  }
  else {
    local_8c = depth;
  }
  tcu::Vector<int,_2>::Vector(&stack0xffffffffffffffa0,local_84,(int)local_8c);
  *&(_targetHeight_local->posB).m_data = VStack_60.m_data;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    getRandomColor((InteractionTestUtil *)&local_74,(Random *)quad_local);
    *(undefined8 *)_targetHeight_local->color[local_64].m_data = local_74;
    *(undefined8 *)(_targetHeight_local->color[local_64].m_data + 2) = local_6c;
  }
  std::fill<float*,float>(_targetHeight_local->depth,(float *)(_targetHeight_local + 1),&local_50);
  return;
}

Assistant:

void computeRandomQuad (de::Random& rnd, gls::FragmentOpUtil::IntegerQuad& quad, int targetWidth, int targetHeight)
{
	// \note In viewport coordinates.
	// \todo [2012-12-18 pyry] Out-of-bounds values.
	// \note Not using depth 1.0 since clearing with 1.0 and rendering with 1.0 may not be same value.
	static const float depthValues[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.51f, 0.6f, 0.8f, 0.95f };

	const int		maxOutOfBounds		= 0;
	const float		minSize				= 0.5f;

	int minW		= deCeilFloatToInt32(minSize * (float)targetWidth);
	int minH		= deCeilFloatToInt32(minSize * (float)targetHeight);
	int maxW		= targetWidth + 2*maxOutOfBounds;
	int maxH		= targetHeight + 2*maxOutOfBounds;

	int width		= rnd.getInt(minW, maxW);
	int	height		= rnd.getInt(minH, maxH);
	int x			= rnd.getInt(-maxOutOfBounds, targetWidth+maxOutOfBounds-width);
	int y			= rnd.getInt(-maxOutOfBounds, targetHeight+maxOutOfBounds-height);

	bool flipX		= rnd.getBool();
	bool flipY		= rnd.getBool();

	float depth		= rnd.choose<float>(DE_ARRAY_BEGIN(depthValues), DE_ARRAY_END(depthValues));

	quad.posA	= IVec2(flipX ? (x+width-1) : x, flipY ? (y+height-1) : y);
	quad.posB	= IVec2(flipX ? x : (x+width-1), flipY ? y : (y+height-1));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quad.color); ndx++)
		quad.color[ndx] = getRandomColor(rnd);

	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), depth);
}